

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockBuilderCopyNode
               (ImGuiID src_node_id,ImGuiID dst_node_id,ImVector<unsigned_int> *out_node_remap_pairs
               )

{
  int *piVar1;
  uint *puVar2;
  ImGuiContext *pIVar3;
  ImGuiDockNode *src_node;
  
  pIVar3 = GImGui;
  if (src_node_id == 0) {
    __assert_fail("src_node_id != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3d87,"void ImGui::DockBuilderCopyNode(ImGuiID, ImGuiID, ImVector<ImGuiID> *)");
  }
  if (dst_node_id == 0) {
    __assert_fail("dst_node_id != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3d88,"void ImGui::DockBuilderCopyNode(ImGuiID, ImGuiID, ImVector<ImGuiID> *)");
  }
  if (out_node_remap_pairs == (ImVector<unsigned_int> *)0x0) {
    __assert_fail("out_node_remap_pairs != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3d89,"void ImGui::DockBuilderCopyNode(ImGuiID, ImGuiID, ImVector<ImGuiID> *)");
  }
  DockBuilderRemoveNode(dst_node_id);
  src_node = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&(pIVar3->DockContext).Nodes,src_node_id);
  if (src_node != (ImGuiDockNode *)0x0) {
    puVar2 = out_node_remap_pairs->Data;
    if (puVar2 != (uint *)0x0) {
      out_node_remap_pairs->Size = 0;
      out_node_remap_pairs->Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar2,GImAllocatorUserData);
      out_node_remap_pairs->Data = (uint *)0x0;
    }
    DockBuilderCopyNodeRec(src_node,dst_node_id,out_node_remap_pairs);
    if ((out_node_remap_pairs->Size & 1) == 0) {
      return;
    }
    __assert_fail("(out_node_remap_pairs->Size % 2) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3d93,"void ImGui::DockBuilderCopyNode(ImGuiID, ImGuiID, ImVector<ImGuiID> *)");
  }
  __assert_fail("src_node != __null",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                ,0x3d8e,"void ImGui::DockBuilderCopyNode(ImGuiID, ImGuiID, ImVector<ImGuiID> *)");
}

Assistant:

void ImGui::DockBuilderCopyNode(ImGuiID src_node_id, ImGuiID dst_node_id, ImVector<ImGuiID>* out_node_remap_pairs)
{
    ImGuiContext* ctx = GImGui;
    IM_ASSERT(src_node_id != 0);
    IM_ASSERT(dst_node_id != 0);
    IM_ASSERT(out_node_remap_pairs != NULL);

    DockBuilderRemoveNode(dst_node_id);

    ImGuiDockNode* src_node = DockContextFindNodeByID(ctx, src_node_id);
    IM_ASSERT(src_node != NULL);

    out_node_remap_pairs->clear();
    DockBuilderCopyNodeRec(src_node, dst_node_id, out_node_remap_pairs);

    IM_ASSERT((out_node_remap_pairs->Size % 2) == 0);
}